

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::PragmaTableInfoBind<false>
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  reference this_00;
  CatalogEntry *args;
  bool local_99;
  string local_98;
  QualifiedName qname;
  
  PragmaShowHelper::GetSchema(return_types,names);
  this_00 = vector<duckdb::Value,_true>::get<true>(input->inputs,0);
  Value::GetValue<std::__cxx11::string>(&local_98,this_00);
  QualifiedName::Parse(&qname,&local_98);
  ::std::__cxx11::string::~string((string *)&local_98);
  Binder::BindSchemaOrCatalog(context,&qname.catalog,&qname.schema);
  args = Catalog::GetEntry(context,TABLE_ENTRY,&qname.catalog,&qname.schema,&qname.name);
  local_99 = false;
  make_uniq<duckdb::PragmaTableFunctionData,duckdb::CatalogEntry&,bool>
            ((duckdb *)&local_98,args,&local_99);
  *(pointer *)this = local_98._M_dataplus._M_p;
  QualifiedName::~QualifiedName(&qname);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> PragmaTableInfoBind(ClientContext &context, TableFunctionBindInput &input,
                                                    vector<LogicalType> &return_types, vector<string> &names) {
	if (IS_PRAGMA_TABLE_INFO) {
		PragmaTableInfoHelper::GetSchema(return_types, names);
	} else {
		PragmaShowHelper::GetSchema(return_types, names);
	}

	auto qname = QualifiedName::Parse(input.inputs[0].GetValue<string>());

	// look up the table name in the catalog
	Binder::BindSchemaOrCatalog(context, qname.catalog, qname.schema);
	auto &entry = Catalog::GetEntry(context, CatalogType::TABLE_ENTRY, qname.catalog, qname.schema, qname.name);
	return make_uniq<PragmaTableFunctionData>(entry, IS_PRAGMA_TABLE_INFO);
}